

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP2Frame.cpp
# Opt level: O0

string * __thiscall
HTTP2Frame::debugFrame_abi_cxx11_(string *__return_storage_ptr__,HTTP2Frame *this,char *frame)

{
  ostream *this_00;
  uint local_1ac;
  stringstream local_1a8 [4];
  uint i;
  stringstream ss;
  ostream local_198 [376];
  char *local_20;
  char *frame_local;
  HTTP2Frame *this_local;
  
  local_20 = frame;
  frame_local = (char *)this;
  this_local = (HTTP2Frame *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  for (local_1ac = 0; local_1ac < this->length + 9; local_1ac = local_1ac + 1) {
    this_00 = (ostream *)std::ostream::operator<<(local_198,std::hex);
    std::ostream::operator<<(this_00,(int)local_20[local_1ac]);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string HTTP2Frame::debugFrame(char *frame) {
  
  std::stringstream ss;
  for(unsigned int i=0; i<length+9; ++i) {
      ss << std::hex << (unsigned int)frame[i];
    }
  return ss.str();
}